

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cpp
# Opt level: O3

int EigenRealGeneral(int n,double **a,double *v,double *vi,double **u,int *iwork,double *work)

{
  undefined1 (*pauVar1) [64];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ulong uVar22;
  undefined8 uVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  long lVar37;
  double **ppdVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  long lVar43;
  long lVar44;
  double *pdVar45;
  long lVar46;
  ulong uVar47;
  double **ppdVar48;
  ulong uVar49;
  uint uVar50;
  ulong uVar51;
  double *pdVar52;
  ulong uVar53;
  ulong uVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar58;
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  double dVar59;
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  double x;
  double dVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  double dVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 in_ZMM14 [64];
  double dVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  uint local_c0;
  uint local_a8;
  int local_78;
  
  uVar24 = n - 1;
  uVar32 = (ulong)uVar24;
  if (0 < n) {
    in_ZMM1 = ZEXT864(0) << 0x40;
    uVar32 = (ulong)uVar24;
    uVar53 = (ulong)uVar24;
    do {
      iVar34 = (int)uVar32;
      if (iVar34 < 0) {
        Exchange((int)uVar53,0,iVar34,iVar34,n,a,work);
        uVar32 = (ulong)(iVar34 - 1);
        EigenRG(int,double**,double*,double*,double**,int*,double*)::is1 = 0;
        goto LAB_0010bfa1;
      }
      uVar31 = 0;
      do {
        if ((uVar53 != uVar31) && ((a[uVar53][uVar31] != 0.0 || (NAN(a[uVar53][uVar31])))))
        goto LAB_0010bca4;
        uVar31 = uVar31 + 1;
      } while (iVar34 + 1 != uVar31);
      Exchange((int)uVar53,0,iVar34,iVar34,n,a,work);
      if (iVar34 == 0) {
        uVar32 = 0xffffffff;
        EigenRG(int,double**,double*,double*,double**,int*,double*)::is1 = 0;
        goto LAB_0010bfa1;
      }
      uVar32 = (ulong)(iVar34 - 1);
      in_ZMM1 = ZEXT864(0) << 0x40;
LAB_0010bca4:
      bVar55 = 0 < (long)uVar53;
      uVar53 = uVar53 - 1;
    } while (bVar55);
  }
  iVar34 = (int)uVar32;
  uVar27 = iVar34 + 1;
  if (iVar34 < 0) {
    uVar35 = 0;
  }
  else {
    in_ZMM1 = ZEXT864(0) << 0x40;
    uVar53 = 0;
    uVar35 = 0;
    do {
      if ((int)uVar35 <= iVar34) {
        lVar41 = 0;
        do {
          if ((uVar53 - (long)(int)uVar35 != lVar41) &&
             ((a[(int)uVar35 + lVar41][uVar53] != 0.0 || (NAN(a[(int)uVar35 + lVar41][uVar53])))))
          goto LAB_0010bd35;
          lVar41 = lVar41 + 1;
        } while (uVar27 - uVar35 != (int)lVar41);
      }
      Exchange((int)uVar53,uVar35,iVar34,uVar35,n,a,work);
      in_ZMM1 = ZEXT864(0) << 0x40;
      uVar35 = uVar35 + 1;
LAB_0010bd35:
      uVar53 = uVar53 + 1;
    } while (uVar53 != uVar27);
  }
  EigenRG(int,double**,double*,double*,double**,int*,double*)::is1 = uVar35;
  if ((int)uVar35 <= iVar34) {
    auVar99 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
    auVar77 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    lVar41 = (long)(int)uVar35;
    auVar78 = vpbroadcastq_avx512f();
    uVar53 = 0;
    do {
      auVar80 = vpbroadcastq_avx512f();
      auVar80 = vporq_avx512f(auVar80,auVar77);
      uVar31 = vpcmpuq_avx512f(auVar80,auVar78,2);
      pdVar15 = work + lVar41 + uVar53;
      bVar55 = (bool)((byte)uVar31 & 1);
      bVar57 = (bool)((byte)(uVar31 >> 1) & 1);
      bVar56 = (bool)((byte)(uVar31 >> 2) & 1);
      bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
      bVar19 = (bool)((byte)(uVar31 >> 4) & 1);
      bVar20 = (bool)((byte)(uVar31 >> 5) & 1);
      bVar21 = (bool)((byte)(uVar31 >> 6) & 1);
      *pdVar15 = (double)((ulong)bVar55 * auVar99._0_8_ | (ulong)!bVar55 * (long)*pdVar15);
      pdVar15[1] = (double)((ulong)bVar57 * auVar99._8_8_ | (ulong)!bVar57 * (long)pdVar15[1]);
      pdVar15[2] = (double)((ulong)bVar56 * auVar99._16_8_ | (ulong)!bVar56 * (long)pdVar15[2]);
      pdVar15[3] = (double)((ulong)bVar18 * auVar99._24_8_ | (ulong)!bVar18 * (long)pdVar15[3]);
      pdVar15[4] = (double)((ulong)bVar19 * auVar99._32_8_ | (ulong)!bVar19 * (long)pdVar15[4]);
      pdVar15[5] = (double)((ulong)bVar20 * auVar99._40_8_ | (ulong)!bVar20 * (long)pdVar15[5]);
      pdVar15[6] = (double)((ulong)bVar21 * auVar99._48_8_ | (ulong)!bVar21 * (long)pdVar15[6]);
      pdVar15[7] = (double)((uVar31 >> 7) * auVar99._56_8_ |
                           (ulong)!SUB81(uVar31 >> 7,0) * (long)pdVar15[7]);
      uVar53 = uVar53 + 8;
    } while (((ulong)(iVar34 - uVar35) + 8 & 0xfffffffffffffff8) != uVar53);
    auVar74._8_8_ = 0x7fffffffffffffff;
    auVar74._0_8_ = 0x7fffffffffffffff;
    in_ZMM2 = ZEXT1664(ZEXT816(0));
    in_ZMM1 = vpbroadcastq_avx512f();
    lVar26 = lVar41;
    bVar55 = false;
    do {
      bVar57 = bVar55;
      auVar99 = ZEXT864(0) << 0x40;
      lVar43 = lVar41;
      iVar25 = uVar35 - 1;
      do {
        if (lVar26 != lVar43) {
          auVar62._8_8_ = 0;
          auVar62._0_8_ = a[lVar26][lVar43];
          auVar62 = vmovhpd_avx(auVar62,a[lVar43][lVar26]);
          auVar62 = vandpd_avx(auVar62,auVar74);
          auVar99 = ZEXT1664(CONCAT88(auVar99._8_8_ + auVar62._8_8_,auVar99._0_8_ + auVar62._0_8_));
        }
        lVar43 = lVar43 + 1;
        iVar25 = iVar25 + 1;
      } while (iVar34 != iVar25);
      auVar62 = vshufpd_avx(auVar99._0_16_,auVar99._0_16_,1);
      in_ZMM11 = ZEXT1664(auVar62);
      dVar58 = auVar62._0_8_;
      if ((dVar58 != 0.0) || (NAN(dVar58))) {
        dVar83 = auVar99._0_8_;
        if ((dVar83 != 0.0) || (NAN(dVar83))) {
          if (dVar83 * 0.5 <= dVar58) {
            auVar99 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            in_ZMM12 = ZEXT1664(auVar62);
          }
          else {
            in_ZMM12 = ZEXT1664(auVar62);
            auVar99 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            do {
              dVar143 = in_ZMM12._0_8_ * 4.0;
              in_ZMM12 = ZEXT864((ulong)dVar143);
              auVar99 = ZEXT864((ulong)(auVar99._0_8_ + auVar99._0_8_));
            } while (dVar143 < dVar83 * 0.5);
          }
          while( true ) {
            dVar59 = in_ZMM12._0_8_;
            dVar143 = auVar99._0_8_;
            if (dVar59 < dVar83 + dVar83) break;
            auVar99 = ZEXT864((ulong)(dVar143 * 0.5));
            in_ZMM12 = ZEXT864((ulong)(dVar59 * 0.25));
          }
          dVar58 = (dVar83 + dVar58) * 0.95;
          in_ZMM11 = ZEXT864((ulong)dVar58);
          if ((dVar83 + dVar59) / dVar143 < dVar58) {
            work[lVar26] = dVar143 * work[lVar26];
            if ((int)uVar35 < n) {
              auVar82._0_8_ = 1.0 / dVar143;
              auVar82._8_8_ = 0;
              pdVar15 = a[lVar26];
              uVar53 = 0;
              auVar99 = vbroadcastsd_avx512f(auVar82);
              do {
                auVar78 = vpbroadcastq_avx512f();
                auVar78 = vporq_avx512f(auVar78,auVar77);
                uVar31 = vpcmpuq_avx512f(auVar78,in_ZMM1,2);
                pdVar45 = pdVar15 + lVar41 + uVar53;
                auVar78._8_8_ = (ulong)((byte)(uVar31 >> 1) & 1) * (long)pdVar45[1];
                auVar78._0_8_ = (ulong)((byte)uVar31 & 1) * (long)*pdVar45;
                auVar78._16_8_ = (ulong)((byte)(uVar31 >> 2) & 1) * (long)pdVar45[2];
                auVar78._24_8_ = (ulong)((byte)(uVar31 >> 3) & 1) * (long)pdVar45[3];
                auVar78._32_8_ = (ulong)((byte)(uVar31 >> 4) & 1) * (long)pdVar45[4];
                auVar78._40_8_ = (ulong)((byte)(uVar31 >> 5) & 1) * (long)pdVar45[5];
                auVar78._48_8_ = (ulong)((byte)(uVar31 >> 6) & 1) * (long)pdVar45[6];
                auVar78._56_8_ = (uVar31 >> 7) * (long)pdVar45[7];
                in_ZMM11 = vmulpd_avx512f(auVar99,auVar78);
                pauVar1 = (undefined1 (*) [64])(pdVar15 + lVar41 + uVar53);
                auVar78 = *pauVar1;
                bVar55 = (bool)((byte)uVar31 & 1);
                auVar80._0_8_ = (ulong)bVar55 * in_ZMM11._0_8_ | (ulong)!bVar55 * auVar78._0_8_;
                bVar55 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar80._8_8_ = (ulong)bVar55 * in_ZMM11._8_8_ | (ulong)!bVar55 * auVar78._8_8_;
                bVar55 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar80._16_8_ = (ulong)bVar55 * in_ZMM11._16_8_ | (ulong)!bVar55 * auVar78._16_8_;
                bVar55 = (bool)((byte)(uVar31 >> 3) & 1);
                auVar80._24_8_ = (ulong)bVar55 * in_ZMM11._24_8_ | (ulong)!bVar55 * auVar78._24_8_;
                bVar55 = (bool)((byte)(uVar31 >> 4) & 1);
                auVar80._32_8_ = (ulong)bVar55 * in_ZMM11._32_8_ | (ulong)!bVar55 * auVar78._32_8_;
                bVar55 = (bool)((byte)(uVar31 >> 5) & 1);
                auVar80._40_8_ = (ulong)bVar55 * in_ZMM11._40_8_ | (ulong)!bVar55 * auVar78._40_8_;
                bVar55 = (bool)((byte)(uVar31 >> 6) & 1);
                auVar80._48_8_ = (ulong)bVar55 * in_ZMM11._48_8_ | (ulong)!bVar55 * auVar78._48_8_;
                auVar80._56_8_ =
                     (uVar31 >> 7) * in_ZMM11._56_8_ | (ulong)!SUB81(uVar31 >> 7,0) * auVar78._56_8_
                ;
                *pauVar1 = auVar80;
                uVar53 = uVar53 + 8;
              } while (((n - lVar41) + 7U & 0xfffffffffffffff8) != uVar53);
            }
            bVar57 = true;
            if (-1 < iVar34) {
              uVar53 = 0;
              do {
                ppdVar38 = a + uVar53;
                uVar53 = uVar53 + 1;
                (*ppdVar38)[lVar26] = dVar143 * (*ppdVar38)[lVar26];
              } while (uVar27 != uVar53);
            }
          }
        }
      }
      lVar26 = lVar26 + 1;
      bVar55 = bVar57;
    } while ((uVar27 != (uint)lVar26) || (lVar26 = lVar41, bVar55 = false, bVar57));
  }
LAB_0010bfa1:
  auVar74 = in_ZMM14._0_16_;
  uVar27 = (uint)uVar32;
  EigenRG(int,double**,double*,double*,double**,int*,double*)::is2 = uVar27;
  if ((int)(EigenRG(int,double**,double*,double*,double**,int*,double*)::is1 + 1) < (int)uVar27) {
    auVar61._8_8_ = 0x7fffffffffffffff;
    auVar61._0_8_ = 0x7fffffffffffffff;
    in_ZMM2 = ZEXT1664(CONCAT88(0x8000000000000000,0x8000000000000000));
    lVar41 = (long)n;
    uVar53 = (ulong)(int)EigenRG(int,double**,double*,double*,double**,int*,double*)::is1;
    in_ZMM1 = ZEXT864(0) << 0x40;
    uVar32 = uVar53 + 1;
    do {
      auVar99 = ZEXT864(0) << 0x40;
      uVar51 = uVar32 & 0xffffffff;
      uVar31 = uVar53;
      do {
        lVar26 = uVar31 + 1;
        auVar62 = vandpd_avx(auVar99._0_16_,auVar61);
        uVar31 = uVar31 + 1;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = a[lVar26][uVar32 - 1];
        auVar82 = vandpd_avx(auVar60,auVar61);
        uVar23 = vcmpsd_avx512f(auVar62,auVar82,1);
        bVar55 = (bool)((byte)uVar23 & 1);
        dVar58 = (double)((ulong)bVar55 * (long)a[lVar26][uVar32 - 1] +
                         (ulong)!bVar55 * auVar99._0_8_);
        auVar99 = ZEXT1664(CONCAT88(auVar99._8_8_,dVar58));
        if (auVar62._0_8_ < auVar82._0_8_) {
          uVar51 = uVar31 & 0xffffffff;
        }
      } while ((long)uVar31 < (long)(int)uVar27);
      iVar34 = (int)uVar51;
      iwork[uVar32] = iVar34;
      if (iVar34 != (int)uVar32) {
        if ((long)uVar32 <= lVar41) {
          pdVar15 = a[iVar34];
          pdVar45 = a[uVar32];
          uVar31 = uVar53;
          do {
            dVar83 = pdVar15[uVar31];
            pdVar15[uVar31] = pdVar45[uVar31];
            pdVar45[uVar31] = dVar83;
            uVar31 = uVar31 + 1;
          } while ((long)uVar31 < lVar41);
        }
        if (-1 < (int)uVar27) {
          uVar31 = 0;
          do {
            pdVar15 = a[uVar31];
            uVar31 = uVar31 + 1;
            dVar83 = pdVar15[iVar34];
            pdVar15[iVar34] = pdVar15[uVar32];
            pdVar15[uVar32] = dVar83;
          } while (uVar27 + 1 != uVar31);
        }
      }
      uVar31 = uVar32;
      if ((dVar58 != 0.0) || (NAN(dVar58))) {
        do {
          pdVar15 = a[uVar31 + 1];
          uVar31 = uVar31 + 1;
          dVar83 = pdVar15[uVar32 - 1];
          if ((dVar83 != 0.0) || (NAN(dVar83))) {
            auVar63._0_8_ = dVar83 / dVar58;
            auVar63._8_8_ = 0;
            pdVar15[uVar32 - 1] = auVar63._0_8_;
            if ((long)uVar32 < lVar41) {
              pdVar45 = a[uVar32];
              auVar64._0_8_ = -auVar63._0_8_;
              auVar64._8_8_ = 0x8000000000000000;
              uVar51 = uVar32;
              do {
                auVar66._8_8_ = 0;
                auVar66._0_8_ = pdVar45[uVar51];
                auVar65._8_8_ = 0;
                auVar65._0_8_ = pdVar15[uVar51];
                auVar62 = vfmadd213sd_fma(auVar66,auVar64,auVar65);
                pdVar15[uVar51] = auVar62._0_8_;
                uVar51 = uVar51 + 1;
              } while ((long)uVar51 < lVar41);
            }
            if (-1 < (int)uVar27) {
              uVar51 = 0;
              do {
                pdVar15 = a[uVar51];
                uVar51 = uVar51 + 1;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = pdVar15[uVar31];
                auVar67._8_8_ = 0;
                auVar67._0_8_ = pdVar15[uVar32];
                auVar62 = vfmadd213sd_fma(auVar68,auVar63,auVar67);
                pdVar15[uVar32] = auVar62._0_8_;
              } while (uVar27 + 1 != uVar51);
            }
          }
        } while ((long)uVar31 < (long)(int)uVar27);
      }
      uVar32 = uVar32 + 1;
      uVar53 = uVar53 + 1;
    } while (uVar27 != (uint)uVar32);
    uVar32 = (ulong)EigenRG(int,double**,double*,double*,double**,int*,double*)::is2;
  }
  uVar27 = EigenRG(int,double**,double*,double*,double**,int*,double*)::is1;
  uVar53 = (ulong)(uint)n;
  if (0 < n) {
    in_ZMM1 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    in_ZMM2 = ZEXT864(0) << 0x40;
    auVar99 = vpbroadcastq_avx512f();
    uVar31 = 0;
    do {
      auVar77 = vpbroadcastq_avx512f();
      uVar51 = 0;
      auVar77 = vpsllq_avx512f(auVar77,3);
      do {
        auVar78 = vpbroadcastq_avx512f();
        auVar78 = vporq_avx512f(auVar78,in_ZMM1);
        uVar54 = vpcmpuq_avx512f(auVar78,auVar99,2);
        auVar78 = vmovdqu64_avx512f(*(undefined1 (*) [64])(u + uVar51));
        auVar79._8_8_ = (ulong)((byte)(uVar54 >> 1) & 1) * auVar78._8_8_;
        auVar79._0_8_ = (ulong)((byte)uVar54 & 1) * auVar78._0_8_;
        auVar79._16_8_ = (ulong)((byte)(uVar54 >> 2) & 1) * auVar78._16_8_;
        auVar79._24_8_ = (ulong)((byte)(uVar54 >> 3) & 1) * auVar78._24_8_;
        auVar79._32_8_ = (ulong)((byte)(uVar54 >> 4) & 1) * auVar78._32_8_;
        auVar79._40_8_ = (ulong)((byte)(uVar54 >> 5) & 1) * auVar78._40_8_;
        auVar79._48_8_ = (ulong)((byte)(uVar54 >> 6) & 1) * auVar78._48_8_;
        auVar79._56_8_ = (uVar54 >> 7) * auVar78._56_8_;
        uVar51 = uVar51 + 8;
        auVar78 = vpaddq_avx512f(auVar79,auVar77);
        vscatterqpd_avx512f(ZEXT864(0) + auVar78,uVar54,in_ZMM2);
      } while ((n + 7U & 0xfffffff8) != uVar51);
      u[uVar31][uVar31] = 1.0;
      uVar31 = uVar31 + 1;
    } while (uVar31 != uVar53);
  }
  auVar62 = in_ZMM2._0_16_;
  iVar34 = (int)uVar32;
  if ((int)(uVar27 + 1) < iVar34) {
    lVar26 = (long)iVar34;
    lVar43 = 0;
    lVar41 = lVar26;
    do {
      lVar40 = lVar41 + -1;
      lVar44 = lVar43;
      if (lVar41 <= lVar26) {
        do {
          lVar37 = lVar44 + 1;
          u[lVar26 + lVar44][lVar40] = a[lVar26 + lVar44][lVar41 + -2];
          lVar44 = lVar37;
        } while ((int)lVar37 != 1);
      }
      if (iwork[lVar40] != (int)lVar40) {
        pdVar15 = u[iwork[lVar40]];
        if (lVar40 <= lVar26) {
          pdVar45 = u[lVar40];
          lVar41 = lVar43;
          do {
            pdVar45[lVar26 + lVar41 + -1] = pdVar15[lVar26 + lVar41 + -1];
            pdVar15[lVar26 + lVar41 + -1] = 0.0;
            lVar41 = lVar41 + 1;
          } while ((int)lVar41 != 2);
        }
        pdVar15[lVar40] = 1.0;
      }
      lVar43 = lVar43 + -1;
      lVar41 = lVar40;
    } while ((int)(uVar27 + 1) < lVar40);
  }
  if (n < 1) {
    auVar82 = ZEXT816(0);
  }
  else {
    auVar69._8_8_ = 0x7fffffffffffffff;
    auVar69._0_8_ = 0x7fffffffffffffff;
    in_ZMM1 = ZEXT1664(auVar69);
    auVar99 = ZEXT1664(ZEXT816(0));
    uVar35 = 0;
    uVar31 = 0;
    do {
      if ((int)uVar35 < n) {
        uVar51 = (ulong)uVar35;
        do {
          auVar70._8_8_ = 0;
          auVar70._0_8_ = a[uVar31][uVar51];
          uVar51 = uVar51 + 1;
          auVar62 = vandpd_avx(auVar70,auVar69);
          in_ZMM2 = ZEXT1664(auVar62);
          auVar99 = ZEXT864((ulong)(auVar99._0_8_ + auVar62._0_8_));
        } while (uVar53 != uVar51);
      }
      auVar82 = auVar99._0_16_;
      if (((long)uVar31 < (long)(int)uVar27) || ((long)iVar34 < (long)uVar31)) {
        in_ZMM2 = ZEXT864((ulong)a[uVar31][uVar31]);
        v[uVar31] = a[uVar31][uVar31];
        vi[uVar31] = 0.0;
      }
      auVar62 = in_ZMM2._0_16_;
      uVar51 = uVar31 + 1;
      uVar35 = (uint)uVar31;
      uVar31 = uVar51;
    } while (uVar51 != uVar53);
  }
  dVar58 = auVar82._0_8_;
  if ((int)uVar27 <= iVar34) {
    auVar71._8_8_ = 0x7fffffffffffffff;
    auVar71._0_8_ = 0x7fffffffffffffff;
    auVar72._8_8_ = 0x7fffffffffffffff;
    auVar72._0_8_ = 0x7fffffffffffffff;
    auVar73._8_8_ = 0x8000000000000000;
    auVar73._0_8_ = 0x8000000000000000;
    lVar26 = (long)(int)uVar27;
    iVar25 = (iVar34 - uVar27) + 1;
    auVar62 = ZEXT816(0) << 0x40;
    dVar83 = 0.0;
    lVar41 = (long)n;
    local_78 = n * 0x1e;
LAB_0010cbbf:
    uVar35 = (uint)uVar32;
    lVar43 = (long)(int)uVar35;
    local_c0 = uVar35 - 1;
    pdVar15 = a[lVar43];
    uVar31 = (ulong)(uVar35 + 2);
    if ((int)uVar35 < (int)(uVar35 + 2)) {
      uVar31 = uVar32;
    }
    dVar143 = pdVar15[lVar43];
    auVar133._8_8_ = 0;
    auVar133._0_8_ = dVar143;
    auVar99 = ZEXT1664(auVar133);
    if ((int)uVar27 < (int)uVar35) {
      iVar28 = uVar35 + (1 - uVar27);
      uVar42 = uVar35 - 2;
      lVar37 = (long)(int)local_c0;
      local_a8 = 0;
      auVar77 = ZEXT1664(auVar133);
      lVar44 = (long)(int)uVar42;
      uVar51 = -lVar44;
      bVar57 = uVar51 == 0;
      bVar55 = (POPCOUNT(uVar51 & 0xff) & 1U) == 0;
      lVar40 = lVar43;
      pdVar45 = pdVar15;
LAB_0010cc9e:
      dVar143 = auVar99._0_8_;
      lVar39 = lVar40 + -1;
      auVar74 = vandpd_avx(auVar77._0_16_,auVar71);
      auVar146._8_8_ = 0;
      auVar146._0_8_ = a[lVar39][lVar40 + -1];
      auVar77 = ZEXT1664(auVar146);
      auVar158._8_8_ = 0;
      auVar158._0_8_ = pdVar45[lVar40 + -1];
      auVar61 = vandpd_avx512vl(auVar158,auVar71);
      auVar60 = vandpd_avx512vl(auVar146,auVar71);
      auVar74 = vaddsd_avx512f(auVar74,auVar60);
      uVar23 = vcmpsd_avx512f(auVar74,auVar62,0);
      bVar56 = (bool)((byte)uVar23 & 1);
      auVar75._0_8_ = (ulong)bVar56 * (long)dVar58 + (ulong)!bVar56 * auVar74._0_8_;
      auVar75._8_8_ = auVar74._8_8_;
      in_ZMM14 = ZEXT1664(auVar75);
      vaddsd_avx512f(auVar61,auVar75);
      vucomisd_avx512f(auVar75);
      if ((!bVar57) || (bVar55)) goto LAB_0010cce5;
      uVar36 = (uint)lVar40;
      goto LAB_0010ccf4;
    }
LAB_0010d305:
    dVar59 = 0.0;
    pdVar15[lVar43] = dVar83 + dVar143;
    v[lVar43] = dVar83 + dVar143;
    goto LAB_0010d325;
  }
LAB_0010c31c:
  if ((dVar58 != 0.0) || (NAN(dVar58))) {
    lVar41 = (long)iVar34;
    if (0 < n) {
      auVar62 = vunpcklpd_avx(auVar62,auVar74);
      auVar98._8_8_ = 0x7fffffffffffffff;
      auVar98._0_8_ = 0x7fffffffffffffff;
      auVar100._8_8_ = 0x8000000000000000;
      auVar100._0_8_ = 0x8000000000000000;
      auVar74 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
      auVar117._8_8_ = 0x7fffffffffffffff;
      auVar117._0_8_ = 0x7fffffffffffffff;
      auVar99 = ZEXT864(0) << 0x40;
      uVar35 = n - 2;
      uVar42 = n - 3;
      uVar32 = uVar53 - 1;
      uVar31 = uVar53;
      do {
        auVar77 = ZEXT1664(auVar62);
        auVar61 = vshufpd_avx(auVar62,auVar62,1);
        auVar78 = ZEXT1664(auVar61);
        uVar54 = (ulong)uVar42;
        uVar51 = (ulong)uVar35;
        dVar83 = vi[uVar32];
        auVar132._8_8_ = 0;
        auVar132._0_8_ = dVar83;
        dVar143 = v[uVar32];
        auVar123._8_8_ = 0;
        auVar123._0_8_ = dVar143;
        uVar47 = uVar32 - 1;
        if (-1e-12 <= dVar83) {
          if ((dVar83 == auVar99._0_8_) && (!NAN(dVar83) && !NAN(auVar99._0_8_))) {
            a[uVar32][uVar32] = 1.0;
            if (uVar32 == 0) break;
            ppdVar38 = a + uVar51;
            lVar26 = uVar51 << 0x20;
            auVar60 = in_ZMM1._0_16_;
            uVar54 = uVar32 & 0xffffffff;
            do {
              pdVar15 = a[uVar51];
              uVar49 = (ulong)(int)uVar54;
              auVar99 = ZEXT864(0) << 0x40;
              auVar62 = auVar99._0_16_;
              bVar55 = uVar32 < uVar49;
              uVar22 = uVar32 - uVar49;
              bVar57 = uVar22 == 0;
              if ((long)uVar49 <= (long)uVar32) {
                do {
                  ppdVar48 = a + uVar49;
                  auVar84._8_8_ = 0;
                  auVar84._0_8_ = pdVar15[uVar49];
                  uVar49 = uVar49 + 1;
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = (*ppdVar48)[uVar32];
                  auVar62 = vfmadd231sd_fma(auVar99._0_16_,auVar84,auVar2);
                  auVar99 = ZEXT1664(auVar62);
                  bVar55 = uVar31 < uVar49;
                  uVar22 = uVar31 - uVar49;
                  bVar57 = uVar22 == 0;
                } while (!bVar57);
              }
              dVar83 = pdVar15[uVar51] - dVar143;
              in_ZMM1 = ZEXT864((ulong)dVar83);
              auVar161._8_8_ = 0;
              auVar161._0_8_ = vi[uVar51];
              auVar61 = vucomisd_avx512f(auVar161);
              auVar99 = ZEXT1664(auVar61);
              iVar25 = (int)uVar51;
              if (bVar55 || bVar57) {
                auVar63 = vucomisd_avx512f(auVar61);
                dVar59 = auVar61._0_8_;
                if ((bVar57) && ((POPCOUNT(uVar22 & 0xff) & 1U) != 0)) {
                  if ((dVar83 == dVar59) && (!NAN(dVar83) && !NAN(dVar59))) {
                    auVar77 = ZEXT1664(auVar82);
                    do {
                      dVar83 = auVar77._0_8_ * 0.01;
                      auVar77 = ZEXT864((ulong)dVar83);
                    } while (dVar58 < dVar58 + dVar83);
                  }
                  pdVar15[uVar32] = -auVar62._0_8_ / dVar83;
                }
                else {
                  auVar145._8_8_ = 0;
                  auVar145._0_8_ = pdVar15[uVar51 + 1];
                  auVar61 = vmulsd_avx512f(auVar63,auVar63);
                  pdVar45 = a[uVar51 + 1];
                  auVar63 = vandpd_avx512vl(auVar60,auVar98);
                  dVar118 = pdVar45[uVar51];
                  auVar163._8_8_ = 0;
                  auVar163._0_8_ = v[uVar51];
                  auVar64 = vsubsd_avx512f(auVar163,auVar123);
                  auVar61 = vfmadd231sd_avx512f(auVar61,auVar64,auVar64);
                  auVar64 = vmulsd_avx512f(auVar62,auVar60);
                  auVar64 = vfmsub231sd_avx512f(auVar64,auVar145,auVar78._0_16_);
                  auVar61 = vdivsd_avx512f(auVar64,auVar61);
                  vandpd_avx512vl(auVar145,auVar98);
                  vucomisd_avx512f(auVar63);
                  vmovsd_avx512f(auVar61);
                  pdVar15[uVar32] = pdVar15[uVar32];
                  auVar85._8_8_ = 0;
                  auVar85._0_8_ = dVar83;
                  if (bVar55 || bVar57) {
                    auVar156._8_8_ = 0;
                    auVar156._0_8_ = dVar118;
                    auVar61 = vfnmsub213sd_avx512f(auVar61,auVar156,auVar78._0_16_);
                    auVar61 = vdivsd_avx512f(auVar61,auVar60);
                    dVar83 = auVar61._0_8_;
                  }
                  else {
                    auVar61 = vfnmsub213sd_avx512f(auVar61,auVar85,auVar62);
                    auVar61 = vdivsd_avx512f(auVar61,auVar145);
                    dVar83 = auVar61._0_8_;
                  }
                  pdVar45[uVar32] = dVar83;
                }
                dVar83 = pdVar15[uVar32];
                auVar86._8_8_ = 0;
                auVar86._0_8_ = dVar83;
                if (((dVar83 != dVar59) || (NAN(dVar83) || NAN(dVar59))) &&
                   ((long)iVar25 <= (long)uVar32)) {
                  auVar61 = vandpd_avx(auVar86,auVar117);
                  dVar83 = auVar61._0_8_;
                  ppdVar48 = ppdVar38;
                  lVar43 = lVar26;
                  if (1.0 / dVar83 + dVar83 <= dVar83) {
                    do {
                      lVar40 = lVar43 >> 0x20;
                      (*ppdVar48)[uVar32] = (*ppdVar48)[uVar32] / dVar83;
                      ppdVar48 = ppdVar48 + 1;
                      lVar43 = lVar43 + 0x100000000;
                    } while (lVar40 < (long)uVar32);
                  }
                }
                uVar54 = uVar51 & 0xffffffff;
                in_ZMM1 = ZEXT1664(auVar60);
              }
              else {
                auVar78 = ZEXT1664(auVar62);
              }
              auVar61 = auVar78._0_16_;
              uVar51 = uVar51 - 1;
              lVar26 = lVar26 + -0x100000000;
              ppdVar38 = ppdVar38 + -1;
              auVar60 = in_ZMM1._0_16_;
            } while (0 < iVar25);
          }
        }
        else {
          pdVar15 = a[uVar32];
          pdVar45 = a[uVar47];
          auVar144._8_8_ = 0;
          auVar144._0_8_ = pdVar15[uVar47];
          vandpd_avx512vl(auVar144,auVar98);
          auVar155._8_8_ = 0;
          auVar155._0_8_ = pdVar45[uVar32];
          auVar60 = vandpd_avx512vl(auVar155,auVar98);
          auVar60 = vucomisd_avx512f(auVar60);
          if (-1e-12 <= dVar83) {
            auVar60 = vxorpd_avx512vl(auVar155,auVar100);
            auVar63 = vandpd_avx512vl(auVar132,auVar98);
            auVar60 = vunpcklpd_avx(auVar60,auVar132);
            auVar157._8_8_ = 0;
            auVar157._0_8_ = pdVar45[uVar47];
            auVar64 = vsubsd_avx512f(auVar157,auVar123);
            auVar65 = vandpd_avx512vl(auVar64,auVar98);
            auVar64 = vunpcklpd_avx512vl(ZEXT816(0) << 0x40,auVar64);
            auVar63 = vaddsd_avx512f(auVar63,auVar65);
            auVar63 = vmovddup_avx512vl(auVar63);
            auVar65 = vdivpd_avx512vl(auVar60,auVar63);
            auVar63 = vdivpd_avx512vl(auVar64,auVar63);
            auVar60 = vshufpd_avx512vl(auVar65,auVar65,3);
            auVar64 = vshufpd_avx512vl(auVar63,auVar63,3);
            auVar60 = vmulpd_avx512vl(auVar60,auVar65);
            auVar64 = vfmadd213pd_avx512vl(auVar64,auVar63,auVar60);
            auVar60 = vshufpd_avx512vl(auVar64,auVar64,1);
            auVar64 = vdivsd_avx512f(auVar64,auVar60);
            vmovsd_avx512f(auVar64);
            pdVar45[uVar47] = pdVar45[uVar47];
            auVar64 = vshufpd_avx512vl(auVar65,auVar65,1);
            auVar64 = vmulsd_avx512f(auVar64,auVar63);
            auVar63 = vshufpd_avx512vl(auVar63,auVar63,1);
            auVar63 = vfmsub213sd_avx512f(auVar63,auVar65,auVar64);
            auVar63 = vdivsd_avx512f(auVar63,auVar60);
            dVar143 = auVar63._0_8_;
          }
          else {
            pdVar45[uVar47] = dVar83 / pdVar15[uVar47];
            dVar143 = -(pdVar15[uVar32] - dVar143) / pdVar15[uVar47];
          }
          auVar78 = ZEXT1664(auVar60);
          pdVar45[uVar32] = dVar143;
          *(undefined1 (*) [16])(pdVar15 + uVar47) = auVar74;
          if (1 < uVar32) {
            auVar138._0_8_ = -dVar83;
            auVar138._8_8_ = 0x8000000000000000;
            ppdVar38 = a + uVar54;
            lVar26 = uVar54 << 0x20;
            auVar61 = vandpd_avx(auVar132,auVar117);
            uVar51 = uVar47 & 0xffffffff;
            auVar60 = vunpcklpd_avx512vl(auVar132,auVar138);
            do {
              pdVar15 = a[uVar54];
              uVar49 = (ulong)(int)uVar51;
              auVar62 = vxorpd_avx512vl(auVar78._0_16_,auVar78._0_16_);
              auVar78 = ZEXT1664(auVar62);
              bVar55 = uVar32 < uVar49;
              uVar22 = uVar32 - uVar49;
              bVar57 = uVar22 == 0;
              if ((long)uVar49 <= (long)uVar32) {
                do {
                  ppdVar48 = a + uVar49;
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = pdVar15[uVar49];
                  auVar62 = vmovddup_avx512vl(auVar3);
                  uVar49 = uVar49 + 1;
                  auVar62 = vfmadd231pd_avx512vl
                                      (auVar78._0_16_,auVar62,
                                       *(undefined1 (*) [16])(*ppdVar48 + uVar47));
                  auVar78 = ZEXT1664(auVar62);
                  bVar55 = uVar31 < uVar49;
                  uVar22 = uVar31 - uVar49;
                  bVar57 = uVar22 == 0;
                } while (!bVar57);
              }
              bVar56 = (POPCOUNT(uVar22 & 0xff) & 1U) == 0;
              auVar164._8_8_ = 0;
              auVar164._0_8_ = pdVar15[uVar54];
              auVar63 = vsubsd_avx512f(auVar164,auVar123);
              auVar169._8_8_ = 0;
              auVar169._0_8_ = vi[uVar54];
              auVar62 = vucomisd_avx512f(auVar169);
              auVar99 = ZEXT1664(auVar62);
              iVar25 = (int)uVar54;
              auVar64 = in_ZMM1._0_16_;
              auVar65 = auVar78._0_16_;
              if (bVar55 || bVar57) {
                auVar66 = vucomisd_avx512f(auVar62);
                if ((!bVar57) || (bVar56)) {
                  auVar66 = vmulsd_avx512f(auVar66,auVar66);
                  pdVar45 = a[uVar54 + 1];
                  auVar170._8_8_ = 0;
                  auVar170._0_8_ = v[uVar54];
                  auVar67 = vsubsd_avx512f(auVar170,auVar123);
                  auVar66 = vfmadd231sd_avx512f(auVar66,auVar67,auVar67);
                  auVar67 = vaddsd_avx512f(auVar67,auVar67);
                  auVar67 = vmulsd_avx512f(auVar132,auVar67);
                  vfmadd231sd_avx512f(auVar66,auVar138,auVar132);
                  auVar66 = vucomisd_avx512f(auVar62);
                  auVar168._8_8_ = 0;
                  auVar168._0_8_ = pdVar45[uVar54];
                  auVar166._8_8_ = 0;
                  auVar166._0_8_ = pdVar15[uVar54 + 1];
                  if (((!bVar57) || ((bVar56 || (auVar67 = vucomisd_avx512f(auVar62), !bVar57)))) ||
                     (bVar56)) {
                    vandpd_avx512vl(auVar166,auVar98);
                    auVar68 = vandpd_avx512vl(auVar64,auVar98);
                  }
                  else {
                    auVar66 = vandpd_avx512vl(auVar63,auVar98);
                    auVar68 = vandpd_avx512vl(auVar168,auVar98);
                    auVar66 = vaddsd_avx512f(auVar61,auVar66);
                    auVar69 = vandpd_avx512vl(auVar166,auVar98);
                    auVar66 = vaddsd_avx512f(auVar66,auVar69);
                    auVar66 = vaddsd_avx512f(auVar66,auVar68);
                    auVar68 = vandpd_avx512vl(auVar64,auVar98);
                    auVar66 = vaddsd_avx512f(auVar68,auVar66);
                    auVar69 = vmulsd_avx512f(auVar82,auVar66);
                    auVar66 = auVar69;
                    do {
                      auVar66 = vmulsd_avx512f(auVar66,ZEXT816(0x3f847ae147ae147b));
                      vaddsd_avx512f(auVar69,auVar66);
                      vucomisd_avx512f(auVar69);
                    } while (!bVar55 && !bVar57);
                  }
                  auVar69 = vmovddup_avx512vl(auVar64);
                  auVar167._8_8_ = 0;
                  auVar167._0_8_ = pdVar15[uVar54 + 1];
                  auVar70 = vmovddup_avx512vl(auVar167);
                  auVar71 = vandpd_avx512vl(auVar66,auVar98);
                  auVar72 = vandpd_avx512vl(auVar67,auVar98);
                  auVar73 = vshufpd_avx512vl(auVar65,auVar65,1);
                  auVar68 = vaddsd_avx512f(auVar61,auVar68);
                  auVar71 = vaddsd_avx512f(auVar72,auVar71);
                  auVar69 = vmulpd_avx512vl(auVar65,auVar69);
                  vucomisd_avx512f(auVar68);
                  auVar67 = vdivsd_avx512f(auVar67,auVar71);
                  auVar66 = vdivsd_avx512f(auVar66,auVar71);
                  auVar71 = vmovddup_avx512vl(auVar71);
                  auVar69 = vfmsub213pd_avx512vl(auVar70,auVar77._0_16_,auVar69);
                  auVar69 = vfmadd231pd_avx512vl(auVar69,auVar60,auVar73);
                  auVar69 = vdivpd_avx512vl(auVar69,auVar71);
                  auVar70 = vmulsd_avx512f(auVar67,auVar67);
                  auVar67 = vmovddup_avx512vl(auVar67);
                  auVar70 = vfmadd231sd_avx512f(auVar70,auVar66,auVar66);
                  auVar66 = vmovddup_avx512vl(auVar66);
                  auVar71 = vxorpd_avx512vl(auVar69,auVar100);
                  auVar71 = vshufpd_avx512vl(auVar69,auVar71,1);
                  auVar67 = vmulpd_avx512vl(auVar67,auVar71);
                  auVar66 = vfmadd213pd_avx512vl(auVar66,auVar69,auVar67);
                  auVar67 = vmovddup_avx512vl(auVar70);
                  auVar66 = vdivpd_avx512vl(auVar66,auVar67);
                  *(undefined1 (*) [16])(pdVar15 + uVar47) = auVar66;
                  if (bVar55 || bVar57) {
                    auVar63 = vmovddup_avx512vl(auVar168);
                    auVar65 = vdivsd_avx512f(auVar132,auVar68);
                    auVar64 = vdivsd_avx512f(auVar64,auVar68);
                    auVar63 = vfnmsub213pd_avx512vl(auVar66,auVar63,auVar77._0_16_);
                    auVar66 = vmovddup_avx512vl(auVar68);
                    auVar63 = vdivpd_avx512vl(auVar63,auVar66);
                    auVar66 = vmulsd_avx512f(auVar65,auVar65);
                    auVar65 = vmovddup_avx512vl(auVar65);
                    auVar66 = vfmadd231sd_avx512f(auVar66,auVar64,auVar64);
                    auVar64 = vmovddup_avx512vl(auVar64);
                    auVar67 = vxorpd_avx512vl(auVar63,auVar100);
                    auVar67 = vshufpd_avx512vl(auVar63,auVar67,1);
                    auVar65 = vmulpd_avx512vl(auVar65,auVar67);
                    auVar63 = vfmadd213pd_avx512vl(auVar64,auVar63,auVar65);
                    auVar64 = vmovddup_avx512vl(auVar66);
                    auVar63 = vdivpd_avx512vl(auVar63,auVar64);
                    *(undefined1 (*) [16])(pdVar45 + uVar47) = auVar63;
                  }
                  else {
                    auVar64 = vfnmsub231sd_avx512f(auVar65,auVar63,auVar66);
                    auVar65 = vshufpd_avx512vl(auVar66,auVar66,1);
                    auVar64 = vfmadd213sd_avx512f(auVar65,auVar132,auVar64);
                    auVar64 = vdivsd_avx512f(auVar64,auVar167);
                    vmovsd_avx512f(auVar64);
                    pdVar45[uVar47] = pdVar45[uVar47];
                    auVar4._8_8_ = 0;
                    auVar4._0_8_ = pdVar15[uVar32];
                    auVar63 = vfnmsub231sd_avx512f(auVar73,auVar63,auVar4);
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = pdVar15[uVar47];
                    auVar63 = vfmadd231sd_avx512f(auVar63,auVar138,auVar5);
                    auVar63 = vdivsd_avx512f(auVar63,auVar167);
                    vmovsd_avx512f(auVar63);
                    pdVar45[uVar32] = pdVar45[uVar32];
                  }
                }
                else {
                  auVar64 = vandpd_avx512vl(auVar63,auVar117);
                  auVar65 = vxorpd_avx512vl(auVar65,auVar100);
                  auVar64 = vaddsd_avx512f(auVar61,auVar64);
                  auVar66 = vdivsd_avx512f(auVar132,auVar64);
                  auVar63 = vdivsd_avx512f(auVar63,auVar64);
                  auVar64 = vmovddup_avx512vl(auVar64);
                  auVar64 = vdivpd_avx512vl(auVar65,auVar64);
                  auVar65 = vmulsd_avx512f(auVar66,auVar66);
                  auVar66 = vmovddup_avx512vl(auVar66);
                  auVar67 = vxorpd_avx512vl(auVar64,auVar100);
                  auVar67 = vshufpd_avx512vl(auVar64,auVar67,1);
                  auVar65 = vfmadd231sd_avx512f(auVar65,auVar63,auVar63);
                  auVar63 = vmovddup_avx512vl(auVar63);
                  auVar66 = vmulpd_avx512vl(auVar66,auVar67);
                  auVar63 = vfmadd213pd_avx512vl(auVar63,auVar64,auVar66);
                  auVar64 = vmovddup_avx512vl(auVar65);
                  auVar63 = vdivpd_avx512vl(auVar63,auVar64);
                  *(undefined1 (*) [16])(pdVar15 + uVar47) = auVar63;
                }
                auVar63 = vandpd_avx512vl(auVar117,*(undefined1 (*) [16])(pdVar15 + uVar47));
                auVar64 = vshufps_avx512vl(auVar63,auVar63,0x4e);
                vmaxsd_avx512f(auVar63,auVar64);
                auVar62 = vucomisd_avx512f(auVar62);
                auVar78 = ZEXT1664(auVar62);
                if (((!bVar57) || (bVar56)) && ((long)iVar25 <= (long)uVar32)) {
                  auVar63 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar62);
                  auVar62 = vaddsd_avx512f(auVar62,auVar63);
                  auVar62 = vucomisd_avx512f(auVar62);
                  auVar78 = ZEXT1664(auVar62);
                  if (uVar32 <= (ulong)(long)iVar25) {
                    auVar62 = vmovddup_avx512vl(auVar62);
                    auVar78 = ZEXT1664(auVar62);
                    ppdVar48 = ppdVar38;
                    lVar43 = lVar26;
                    do {
                      pdVar15 = *ppdVar48;
                      lVar40 = lVar43 >> 0x20;
                      lVar43 = lVar43 + 0x100000000;
                      ppdVar48 = ppdVar48 + 1;
                      auVar63 = vdivpd_avx512vl(*(undefined1 (*) [16])(pdVar15 + uVar47),auVar62);
                      *(undefined1 (*) [16])(pdVar15 + uVar47) = auVar63;
                    } while (lVar40 < (long)uVar32);
                  }
                }
                uVar51 = uVar54 & 0xffffffff;
              }
              else {
                in_ZMM1 = ZEXT1664(auVar63);
                auVar77 = ZEXT1664(auVar65);
              }
              auVar62 = auVar77._0_16_;
              uVar54 = uVar54 - 1;
              lVar26 = lVar26 + -0x100000000;
              ppdVar38 = ppdVar38 + -1;
            } while (0 < iVar25);
            auVar61 = vshufpd_avx(auVar62,auVar62,1);
          }
        }
        auVar62 = vunpcklpd_avx(auVar62,auVar61);
        uVar35 = uVar35 - 1;
        uVar42 = uVar42 - 1;
        uVar31 = uVar31 - 1;
        bVar55 = 0 < (long)uVar32;
        uVar32 = uVar47;
      } while (bVar55);
      uVar32 = 0;
      do {
        if (((long)uVar32 < (long)(int)uVar27) || (lVar41 < (long)uVar32)) {
          pdVar15 = a[uVar32];
          pdVar45 = u[uVar32];
          uVar31 = uVar32;
          do {
            pdVar45[uVar31] = pdVar15[uVar31];
            uVar31 = uVar31 + 1;
          } while (uVar53 != uVar31);
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar53);
    }
    if ((int)uVar27 < n) {
      lVar43 = (long)n;
      lVar26 = (long)(int)uVar27;
      do {
        lVar40 = (long)(int)uVar24;
        if (lVar41 < (int)uVar24) {
          lVar40 = lVar41;
        }
        if (lVar40 <= lVar26) {
          lVar40 = lVar26;
        }
        lVar43 = lVar43 + -1;
        if ((int)uVar27 <= iVar34) {
          lVar44 = lVar26;
          do {
            ppdVar38 = u + lVar44;
            auVar99 = ZEXT864(0) << 0x40;
            lVar37 = lVar26;
            do {
              ppdVar48 = a + lVar37;
              auVar87._8_8_ = 0;
              auVar87._0_8_ = (*ppdVar38)[lVar37];
              lVar37 = lVar37 + 1;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = (*ppdVar48)[lVar43];
              auVar74 = vfmadd231sd_fma(auVar99._0_16_,auVar87,auVar6);
              auVar99 = ZEXT1664(auVar74);
            } while (lVar40 + 1 != lVar37);
            lVar44 = lVar44 + 1;
            (*ppdVar38)[lVar43] = auVar74._0_8_;
          } while (iVar34 + 1 != (int)lVar44);
        }
        uVar24 = uVar24 - 1;
      } while (lVar26 < lVar43);
    }
  }
LAB_0010d576:
  if (n != 0) {
    if ((int)uVar27 < iVar34) {
      auVar99 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      lVar41 = (long)(int)uVar27;
      auVar77 = vpbroadcastq_avx512f();
      do {
        if (0 < n) {
          pdVar15 = u[lVar41];
          auVar14._8_8_ = 0;
          auVar14._0_8_ = work[lVar41];
          auVar78 = vbroadcastsd_avx512f(auVar14);
          uVar32 = 0;
          do {
            auVar80 = vpbroadcastq_avx512f();
            auVar80 = vporq_avx512f(auVar80,auVar99);
            uVar31 = vpcmpuq_avx512f(auVar80,auVar77,2);
            pdVar45 = pdVar15 + uVar32;
            auVar81._8_8_ = (ulong)((byte)(uVar31 >> 1) & 1) * (long)pdVar45[1];
            auVar81._0_8_ = (ulong)((byte)uVar31 & 1) * (long)*pdVar45;
            auVar81._16_8_ = (ulong)((byte)(uVar31 >> 2) & 1) * (long)pdVar45[2];
            auVar81._24_8_ = (ulong)((byte)(uVar31 >> 3) & 1) * (long)pdVar45[3];
            auVar81._32_8_ = (ulong)((byte)(uVar31 >> 4) & 1) * (long)pdVar45[4];
            auVar81._40_8_ = (ulong)((byte)(uVar31 >> 5) & 1) * (long)pdVar45[5];
            auVar81._48_8_ = (ulong)((byte)(uVar31 >> 6) & 1) * (long)pdVar45[6];
            auVar81._56_8_ = (uVar31 >> 7) * (long)pdVar45[7];
            auVar80 = vmulpd_avx512f(auVar78,auVar81);
            pdVar45 = pdVar15 + uVar32;
            bVar55 = (bool)((byte)uVar31 & 1);
            bVar57 = (bool)((byte)(uVar31 >> 1) & 1);
            bVar56 = (bool)((byte)(uVar31 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar31 >> 4) & 1);
            bVar20 = (bool)((byte)(uVar31 >> 5) & 1);
            bVar21 = (bool)((byte)(uVar31 >> 6) & 1);
            *pdVar45 = (double)((ulong)bVar55 * auVar80._0_8_ | (ulong)!bVar55 * (long)*pdVar45);
            pdVar45[1] = (double)((ulong)bVar57 * auVar80._8_8_ | (ulong)!bVar57 * (long)pdVar45[1])
            ;
            pdVar45[2] = (double)((ulong)bVar56 * auVar80._16_8_ | (ulong)!bVar56 * (long)pdVar45[2]
                                 );
            pdVar45[3] = (double)((ulong)bVar18 * auVar80._24_8_ | (ulong)!bVar18 * (long)pdVar45[3]
                                 );
            pdVar45[4] = (double)((ulong)bVar19 * auVar80._32_8_ | (ulong)!bVar19 * (long)pdVar45[4]
                                 );
            pdVar45[5] = (double)((ulong)bVar20 * auVar80._40_8_ | (ulong)!bVar20 * (long)pdVar45[5]
                                 );
            pdVar45[6] = (double)((ulong)bVar21 * auVar80._48_8_ | (ulong)!bVar21 * (long)pdVar45[6]
                                 );
            pdVar45[7] = (double)((uVar31 >> 7) * auVar80._56_8_ |
                                 (ulong)!SUB81(uVar31 >> 7,0) * (long)pdVar45[7]);
            uVar32 = uVar32 + 8;
          } while ((n + 7U & 0xfffffff8) != uVar32);
        }
        lVar41 = lVar41 + 1;
      } while (iVar34 + 1 != (int)lVar41);
    }
    if (0 < n) {
      iVar25 = 0;
      do {
        if ((iVar25 < (int)uVar27) || (iVar34 < iVar25)) {
          iVar28 = uVar27 - iVar25;
          if (uVar27 - iVar25 == 0 || (int)uVar27 < iVar25) {
            iVar28 = iVar25;
          }
          if (iVar28 != (int)work[iVar28]) {
            pdVar15 = u[iVar28];
            uVar32 = 0;
            pdVar45 = u[(int)work[iVar28]];
            do {
              dVar58 = pdVar15[uVar32];
              pdVar15[uVar32] = pdVar45[uVar32];
              pdVar45[uVar32] = dVar58;
              uVar32 = uVar32 + 1;
            } while (uVar53 != uVar32);
          }
        }
        iVar25 = iVar25 + 1;
      } while (iVar25 != n);
      if (0 < n) {
        uVar32 = 0;
        do {
          if ((vi[uVar32] != 0.0) || (NAN(vi[uVar32]))) {
            return 2;
          }
          uVar32 = uVar32 + 1;
        } while (uVar53 != uVar32);
      }
    }
  }
  return 0;
LAB_0010cce5:
  lVar40 = lVar40 + -1;
  bVar57 = lVar40 - lVar26 == 0;
  bVar55 = (POPCOUNT(lVar40 - lVar26 & 0xff) & 1U) == 0;
  pdVar45 = a[lVar39];
  uVar36 = uVar27;
  if (!bVar57 && lVar26 <= lVar40) goto LAB_0010cc9e;
LAB_0010ccf4:
  if (uVar36 == uVar35) goto LAB_0010d305;
  pdVar45 = a[lVar37];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = pdVar45[lVar43];
  auVar159._8_8_ = 0;
  auVar159._0_8_ = pdVar15[lVar37];
  auVar74 = vmulsd_avx512f(auVar159,auVar7);
  dVar59 = pdVar45[lVar37];
  if (uVar36 != local_c0) {
    bVar55 = local_78 == 0;
    local_78 = local_78 + -1;
    if (bVar55) {
      if (uVar35 != 0) {
        puts("\nInternal error in \'EigenRealGeneral\'.");
        printf("rc = %d\n",uVar32);
        return 1;
      }
      goto LAB_0010d576;
    }
    lVar40 = lVar26;
    iVar29 = iVar28;
    if ((local_a8 == 0x14) || (local_a8 == 10)) {
      do {
        a[lVar40][lVar40] = a[lVar40][lVar40] - dVar143;
        iVar29 = iVar29 + -1;
        lVar40 = lVar40 + 1;
      } while (iVar29 != 0);
      dVar83 = dVar143 + dVar83;
      auVar134._8_8_ = 0;
      auVar134._0_8_ = pdVar15[lVar37];
      auVar139._8_8_ = 0;
      auVar139._0_8_ = pdVar45[lVar44];
      auVar74 = vandpd_avx(auVar134,auVar71);
      auVar61 = vandpd_avx(auVar139,auVar71);
      dVar143 = auVar74._0_8_ + auVar61._0_8_;
      dVar59 = dVar143 * 0.75;
      auVar99 = ZEXT864((ulong)dVar59);
      auVar140._8_8_ = 0;
      auVar140._0_8_ = dVar143;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = dVar143 * -0.4375;
      auVar74 = vmulsd_avx512f(auVar140,auVar147);
    }
    uVar33 = uVar42;
    if ((int)uVar36 <= (int)uVar42) {
      auVar74 = vxorpd_avx512vl(auVar74,auVar73);
      uVar54 = 0;
      pdVar52 = a[lVar44];
      auVar77 = ZEXT864((ulong)pdVar52[lVar44]);
      do {
        auVar65 = auVar77._0_16_;
        in_ZMM1 = ZEXT1664(auVar65);
        auVar61 = vsubsd_avx512f(auVar99._0_16_,auVar65);
        auVar148._8_8_ = 0;
        auVar148._0_8_ = dVar59;
        auVar60 = vsubsd_avx512f(auVar148,auVar65);
        auVar160._8_8_ = 0;
        auVar160._0_8_ = a[lVar44 + uVar54 + 1][lVar44 + uVar54 + 1];
        auVar63 = vsubsd_avx512f(auVar160,auVar65);
        auVar63 = vsubsd_avx512f(auVar63,auVar61);
        auVar63 = vsubsd_avx512f(auVar63,auVar60);
        auVar61 = vfmadd213sd_fma(auVar60,auVar61,auVar74);
        auVar60 = vandpd_avx512vl(auVar63,auVar71);
        auVar101._8_8_ = 0;
        auVar101._0_8_ = a[lVar44 + uVar54 + 2][lVar44 + uVar54 + 1];
        auVar64 = vandpd_avx512vl(auVar101,auVar71);
        auVar119._8_8_ = 0;
        auVar119._0_8_ =
             auVar61._0_8_ / a[lVar44 + uVar54 + 1][lVar44 + uVar54] + pdVar52[lVar44 + uVar54 + 1];
        auVar61 = vandpd_avx(auVar119,auVar71);
        auVar61 = vaddsd_avx512f(auVar61,auVar60);
        auVar61 = vaddsd_avx512f(auVar64,auVar61);
        auVar60 = vdivsd_avx512f(auVar119,auVar61);
        in_ZMM12 = ZEXT1664(auVar60);
        auVar63 = vunpcklpd_avx512vl(auVar63,auVar101);
        auVar61 = vmovddup_avx512vl(auVar61);
        auVar61 = vdivpd_avx(auVar63,auVar61);
        in_ZMM11 = ZEXT1664(auVar61);
        uVar33 = uVar36;
        if ((long)(int)uVar36 + uVar51 == uVar54) break;
        pdVar16 = pdVar52 + lVar44 + (uVar54 - 1);
        pdVar52 = a[lVar44 + (uVar54 - 1)];
        auVar63 = vandpd_avx512vl(auVar65,auVar72);
        auVar64 = vandpd_avx512vl(auVar160,auVar72);
        auVar61 = vandpd_avx(auVar61,auVar72);
        auVar102._0_8_ = auVar61._0_8_ + auVar61._8_8_;
        auVar102._8_8_ = auVar61._0_8_ + auVar61._8_8_;
        lVar40 = uVar54 - 1;
        auVar77 = ZEXT864((ulong)pdVar52[lVar44 + lVar40]);
        uVar54 = uVar54 - 1;
        auVar165._8_8_ = 0;
        auVar165._0_8_ = *pdVar16;
        auVar61 = vandpd_avx512vl(auVar165,auVar72);
        auVar162._8_8_ = 0;
        auVar162._0_8_ = pdVar52[lVar44 + lVar40];
        auVar65 = vandpd_avx512vl(auVar162,auVar72);
        auVar63 = vaddsd_avx512f(auVar63,auVar65);
        auVar60 = vandpd_avx512vl(auVar60,auVar72);
        auVar63 = vaddsd_avx512f(auVar64,auVar63);
        auVar60 = vmulsd_avx512f(auVar60,auVar63);
        vfmadd213sd_avx512f(auVar102,auVar61,auVar60);
        vucomisd_avx512f(auVar60);
      } while ((uVar54 != 0) || (uVar33 = uVar35 - 1, (POPCOUNT(uVar54 & 0xff) & 1U) == 0));
    }
    if ((int)(uVar33 + 2) <= (int)uVar35) {
      lVar40 = 0;
      do {
        pdVar52 = a[(long)(int)uVar33 + lVar40 + 2];
        pdVar52[(int)uVar33 + lVar40] = 0.0;
        if (lVar40 != 0) {
          pdVar52[(long)(int)uVar33 + lVar40 + -1] = 0.0;
        }
        lVar40 = lVar40 + 1;
      } while ((uVar35 - 1) - uVar33 != (int)lVar40);
    }
    if ((int)uVar33 < (int)uVar35) {
      lVar39 = (long)(int)uVar33;
      uVar50 = uVar33 + 3;
      lVar40 = lVar39;
      do {
        auVar124 = in_ZMM12._0_16_;
        dVar143 = auVar99._0_8_;
        auVar74 = in_ZMM11._0_16_;
        uVar54 = (ulong)uVar50;
        if ((int)uVar35 < (int)uVar50) {
          uVar54 = uVar32;
        }
        if (lVar40 == lVar39) {
LAB_0010cffd:
          dVar118 = auVar74._0_8_;
          auVar61 = vshufpd_avx(auVar74,auVar74,1);
          auVar141._8_8_ = 0x8000000000000000;
          auVar141._0_8_ = 0x8000000000000000;
          auVar104._8_8_ = 0;
          auVar104._0_8_ = dVar118 * dVar118;
          auVar60 = vfmadd231sd_fma(auVar104,auVar124,auVar124);
          auVar60 = vfmadd231sd_fma(auVar60,auVar61,auVar61);
          auVar60 = vsqrtsd_avx(auVar60,auVar60);
          auVar63 = vxorpd_avx512vl(auVar60,auVar141);
          uVar23 = vcmpsd_avx512f(auVar63,auVar60,2);
          bVar55 = (bool)((byte)uVar23 & 1);
          auVar76._0_8_ = (ulong)bVar55 * auVar60._0_8_ + (ulong)!bVar55 * auVar63._0_8_;
          auVar76._8_8_ = auVar63._8_8_;
          uVar23 = vcmpsd_avx512f(auVar62,auVar124,2);
          bVar55 = (bool)((byte)uVar23 & 1);
          auVar60 = vxorpd_avx512vl(auVar76,auVar141);
          dVar59 = (double)((ulong)bVar55 * auVar76._0_8_ + (ulong)!bVar55 * auVar60._0_8_);
          if (lVar40 == lVar39) {
            if (uVar36 != uVar33) {
              auVar105._0_8_ = -a[lVar39][lVar39 + -1];
              auVar105._8_8_ = 0x8000000000000000;
              dVar143 = (double)vmovlpd_avx(auVar105);
              a[lVar39][lVar39 + -1] = dVar143;
            }
          }
          else {
            a[lVar40][lVar40 + -1] = dVar143 * -dVar59;
          }
          dVar143 = auVar124._0_8_ + dVar59;
          auVar142._0_8_ = dVar118 / dVar59;
          auVar142._8_8_ = auVar74._8_8_;
          auVar89._0_8_ = auVar61._0_8_ / dVar59;
          auVar89._8_8_ = auVar61._8_8_;
          in_ZMM1 = ZEXT1664(auVar89);
          auVar135._0_8_ = dVar143 / dVar59;
          auVar135._8_8_ = 0;
          auVar99 = ZEXT1664(auVar135);
          auVar106._8_8_ = dVar143;
          auVar106._0_8_ = dVar143;
          auVar74 = vdivpd_avx(auVar74,auVar106);
          in_ZMM11 = ZEXT1664(auVar74);
          if (lVar40 == lVar37) {
            if ((int)local_c0 < n) {
              pdVar52 = a[lVar37 + 1];
              lVar46 = lVar37;
              do {
                auVar107._8_8_ = 0;
                auVar107._0_8_ = pdVar45[lVar46];
                auVar126._8_8_ = 0;
                auVar126._0_8_ = pdVar52[lVar46];
                auVar61 = vfmadd213sd_fma(auVar126,auVar74,auVar107);
                auVar60 = vfnmadd231sd_fma(auVar107,auVar61,auVar135);
                pdVar45[lVar46] = auVar60._0_8_;
                auVar8._8_8_ = 0;
                auVar8._0_8_ = pdVar52[lVar46];
                auVar61 = vfnmadd213sd_fma(auVar61,auVar142,auVar8);
                pdVar52[lVar46] = auVar61._0_8_;
                lVar46 = lVar46 + 1;
              } while (lVar41 != lVar46);
            }
            if (-1 < (int)uVar31) {
              lVar46 = 0;
              do {
                pdVar52 = a[lVar46];
                lVar46 = lVar46 + 1;
                auVar127._8_8_ = 0;
                auVar127._0_8_ = pdVar52[lVar37 + 1];
                auVar108._8_8_ = 0;
                auVar108._0_8_ = pdVar52[lVar37];
                auVar149._8_8_ = 0;
                auVar149._0_8_ = auVar142._0_8_ * pdVar52[lVar37 + 1];
                auVar61 = vfmadd231sd_fma(auVar149,auVar135,auVar108);
                auVar60 = vfnmadd213sd_fma(auVar61,auVar74,auVar127);
                pdVar52[lVar37] = pdVar52[lVar37] - auVar61._0_8_;
                pdVar52[lVar37 + 1] = auVar60._0_8_;
              } while (uVar31 + 1 != lVar46);
            }
            lVar46 = 0;
            do {
              pdVar52 = u[lVar26 + lVar46];
              lVar46 = lVar46 + 1;
              auVar150._8_8_ = 0;
              auVar150._0_8_ = pdVar52[lVar37 + 1];
              auVar109._8_8_ = 0;
              auVar109._0_8_ = pdVar52[lVar37];
              auVar128._8_8_ = 0;
              auVar128._0_8_ = auVar142._0_8_ * pdVar52[lVar37 + 1];
              auVar125 = vfmadd231sd_fma(auVar128,auVar135,auVar109);
              auVar61 = vfnmadd231sd_fma(auVar150,auVar125,auVar74);
              pdVar52[lVar37] = pdVar52[lVar37] - auVar125._0_8_;
              pdVar52[lVar37 + 1] = auVar61._0_8_;
            } while (iVar25 != (int)lVar46);
          }
          else {
            if (lVar40 < lVar41) {
              pdVar52 = a[lVar40];
              pdVar16 = a[lVar40 + 1];
              pdVar17 = a[lVar40 + 2];
              auVar61 = vshufpd_avx(auVar74,auVar74,1);
              lVar46 = lVar40;
              do {
                auVar110._8_8_ = 0;
                auVar110._0_8_ = pdVar52[lVar46];
                auVar151._8_8_ = 0;
                auVar151._0_8_ = pdVar16[lVar46];
                auVar60 = vfmadd213sd_fma(auVar151,auVar74,auVar110);
                auVar9._8_8_ = 0;
                auVar9._0_8_ = pdVar17[lVar46];
                auVar60 = vfmadd231sd_fma(auVar60,auVar61,auVar9);
                auVar63 = vfnmadd231sd_fma(auVar110,auVar60,auVar135);
                pdVar52[lVar46] = auVar63._0_8_;
                auVar111._8_8_ = 0;
                auVar111._0_8_ = pdVar16[lVar46];
                auVar63 = vfnmadd231sd_fma(auVar111,auVar60,auVar142);
                pdVar16[lVar46] = auVar63._0_8_;
                auVar10._8_8_ = 0;
                auVar10._0_8_ = pdVar17[lVar46];
                auVar60 = vfnmadd213sd_fma(auVar60,auVar89,auVar10);
                pdVar17[lVar46] = auVar60._0_8_;
                lVar46 = lVar46 + 1;
              } while (lVar46 < lVar41);
            }
            uVar30 = (int)lVar40 + 3;
            if ((int)uVar35 < (int)uVar30) {
              uVar30 = uVar35;
            }
            if (-1 < (int)uVar30) {
              lVar46 = 0;
              do {
                pdVar52 = a[lVar46];
                lVar46 = lVar46 + 1;
                auVar112._8_8_ = 0;
                auVar112._0_8_ = pdVar52[lVar40];
                auVar152._8_8_ = 0;
                auVar152._0_8_ =
                     auVar142._0_8_ * SUB168(*(undefined1 (*) [16])(pdVar52 + lVar40 + 1),0);
                auVar61 = vfmadd231sd_fma(auVar152,auVar135,auVar112);
                auVar11._8_8_ = 0;
                auVar11._0_8_ = pdVar52[lVar40 + 2];
                auVar61 = vfmadd231sd_fma(auVar61,auVar89,auVar11);
                auVar153._0_8_ = auVar61._0_8_;
                auVar153._8_8_ = auVar153._0_8_;
                auVar61 = vfnmadd213pd_fma(auVar153,auVar74,
                                           *(undefined1 (*) [16])(pdVar52 + lVar40 + 1));
                pdVar52[lVar40] = pdVar52[lVar40] - auVar153._0_8_;
                *(undefined1 (*) [16])(pdVar52 + lVar40 + 1) = auVar61;
              } while (uVar54 + 1 != lVar46);
            }
            lVar46 = 0;
            do {
              pdVar52 = u[lVar26 + lVar46];
              lVar46 = lVar46 + 1;
              auVar113._8_8_ = 0;
              auVar113._0_8_ = pdVar52[lVar40];
              auVar129._8_8_ = 0;
              auVar129._0_8_ =
                   auVar142._0_8_ * SUB168(*(undefined1 (*) [16])(pdVar52 + lVar40 + 1),0);
              auVar61 = vfmadd231sd_fma(auVar129,auVar135,auVar113);
              auVar12._8_8_ = 0;
              auVar12._0_8_ = pdVar52[lVar40 + 2];
              auVar125 = vfmadd231sd_fma(auVar61,auVar89,auVar12);
              auVar61 = vmovddup_avx512vl(auVar125);
              auVar61 = vfnmadd213pd_avx512vl
                                  (auVar61,auVar74,*(undefined1 (*) [16])(pdVar52 + lVar40 + 1));
              pdVar52[lVar40] = pdVar52[lVar40] - auVar125._0_8_;
              *(undefined1 (*) [16])(pdVar52 + lVar40 + 1) = auVar61;
            } while (iVar25 != (int)lVar46);
          }
        }
        else {
          auVar120 = ZEXT816(0) << 0x40;
          if (lVar40 != lVar37) {
            auVar120._8_8_ = 0;
            auVar120._0_8_ = a[lVar40 + 2][lVar40 + -1];
          }
          auVar125._8_8_ = 0;
          auVar125._0_8_ = a[lVar40][lVar40 + -1];
          auVar103._8_8_ = 0;
          auVar103._0_8_ = a[lVar40 + 1][lVar40 + -1];
          auVar74 = vandpd_avx(auVar125,auVar71);
          auVar61 = vandpd_avx(auVar103,auVar71);
          auVar60 = vandpd_avx(auVar120,auVar71);
          auVar63 = vunpcklpd_avx(auVar103,auVar120);
          in_ZMM11 = ZEXT1664(auVar63);
          dVar143 = auVar74._0_8_ + auVar61._0_8_ + auVar60._0_8_;
          auVar99 = ZEXT864((ulong)dVar143);
          if ((dVar143 != 0.0) || (NAN(dVar143))) {
            auVar88._8_8_ = dVar143;
            auVar88._0_8_ = dVar143;
            auVar124._0_8_ = a[lVar40][lVar40 + -1] / dVar143;
            auVar124._8_8_ = 0;
            auVar74 = vdivpd_avx(auVar63,auVar88);
            goto LAB_0010cffd;
          }
        }
        in_ZMM12 = ZEXT1664(auVar125);
        lVar40 = lVar40 + 1;
        uVar50 = uVar50 + 1;
      } while (lVar40 != lVar43);
    }
    local_a8 = local_a8 + 1;
    bVar57 = local_a8 == 0;
    bVar55 = (POPCOUNT(local_a8 & 0xff) & 1U) == 0;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = pdVar15[lVar43];
    auVar99 = ZEXT1664(auVar136);
    auVar77 = ZEXT1664(auVar136);
    lVar40 = lVar43;
    pdVar45 = pdVar15;
    goto LAB_0010cc9e;
  }
  dVar118 = dVar143 + dVar83;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar59 - dVar143;
  auVar63 = vmulsd_avx512f(auVar90,ZEXT816(0x3fe0000000000000));
  in_ZMM12 = ZEXT1664(auVar63);
  pdVar15[lVar43] = dVar118;
  pdVar45[lVar37] = dVar83 + dVar59;
  auVar61 = vfmadd213sd_avx512f(auVar63,auVar63,auVar74);
  auVar61 = vandpd_avx512vl(auVar61,auVar72);
  auVar60 = vucomisd_avx512f(ZEXT816(0xbd719799812dea11));
  auVar61 = vsqrtsd_avx(auVar61,auVar61);
  in_ZMM1 = ZEXT1664(auVar61);
  dVar143 = auVar61._0_8_;
  if (uVar36 < local_c0) {
    dVar118 = dVar118 + auVar63._0_8_;
    dVar59 = -dVar143;
    in_ZMM11 = ZEXT1664(CONCAT88(in_ZMM11._8_8_,auVar60._0_8_));
    v[lVar37] = dVar118;
    v[lVar43] = dVar118;
    vi[lVar37] = dVar143;
    local_c0 = uVar42;
LAB_0010d325:
    vi[lVar43] = dVar59;
  }
  else {
    uVar23 = vcmpsd_avx512f(auVar62,auVar63,2);
    bVar55 = (bool)((byte)uVar23 & 1);
    dVar143 = auVar63._0_8_ +
              (double)((ulong)bVar55 * (long)dVar143 + (ulong)!bVar55 * (long)-dVar143);
    auVar91._8_8_ = 0;
    auVar91._0_8_ = dVar143;
    auVar61 = vdivsd_avx512f(auVar74,auVar91);
    uVar23 = vcmpsd_avx512f(auVar91,auVar62,4);
    bVar55 = (bool)((byte)uVar23 & 1);
    v[lVar37] = dVar118 + dVar143;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = dVar143;
    auVar74 = vandpd_avx(auVar92,auVar71);
    v[lVar43] = (double)((ulong)bVar55 * (long)(dVar118 - auVar61._0_8_) +
                        (ulong)!bVar55 * (long)(dVar118 + dVar143));
    vi[lVar37] = 0.0;
    vi[lVar43] = 0.0;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = pdVar15[lVar37];
    auVar61 = vandpd_avx(auVar121,auVar71);
    dVar59 = auVar74._0_8_ + auVar61._0_8_;
    in_ZMM14 = ZEXT864((ulong)dVar59);
    dVar143 = dVar143 / dVar59;
    auVar130._0_8_ = pdVar15[lVar37] / dVar59;
    auVar130._8_8_ = 0;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = dVar143 * dVar143;
    auVar74 = vfmadd231sd_fma(auVar122,auVar130,auVar130);
    auVar74 = vsqrtsd_avx(auVar74,auVar74);
    auVar131._0_8_ = auVar130._0_8_ / auVar74._0_8_;
    auVar131._8_8_ = 0;
    in_ZMM12 = ZEXT1664(auVar131);
    auVar137._0_8_ = dVar143 / auVar74._0_8_;
    auVar137._8_8_ = 0;
    auVar154._0_8_ = -auVar131._0_8_;
    auVar154._8_8_ = 0x8000000000000000;
    if ((int)uVar35 <= n) {
      lVar40 = 0;
      do {
        dVar143 = pdVar45[lVar37 + lVar40];
        auVar93._8_8_ = 0;
        auVar93._0_8_ = dVar143;
        auVar114._8_8_ = 0;
        auVar114._0_8_ = auVar131._0_8_ * pdVar15[lVar37 + lVar40];
        auVar61 = vfmadd231sd_fma(auVar114,auVar137,auVar93);
        pdVar45[lVar37 + lVar40] = auVar61._0_8_;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = pdVar15[lVar37 + lVar40];
        auVar94._8_8_ = 0;
        auVar94._0_8_ = auVar154._0_8_ * dVar143;
        auVar61 = vfmadd231sd_fma(auVar94,auVar137,auVar13);
        pdVar15[lVar37 + lVar40] = auVar61._0_8_;
        lVar40 = lVar40 + 1;
      } while ((n + 1) - uVar35 != (int)lVar40);
    }
    if (-1 < (int)uVar35) {
      uVar32 = 0;
      do {
        pdVar15 = a[uVar32];
        uVar32 = uVar32 + 1;
        auVar115._8_8_ = 0;
        auVar115._0_8_ = pdVar15[lVar43];
        auVar95._8_8_ = 0;
        auVar95._0_8_ = pdVar15[lVar37];
        auVar61 = vmulsd_avx512f(auVar131,auVar115);
        auVar60 = vfmadd231sd_avx512f(auVar61,auVar137,auVar95);
        auVar96._8_8_ = 0;
        auVar96._0_8_ = auVar154._0_8_ * pdVar15[lVar37];
        auVar61 = vfmadd231sd_fma(auVar96,auVar137,auVar115);
        vmovsd_avx512f(auVar60);
        pdVar15[lVar37] = pdVar15[lVar37];
        pdVar15[lVar43] = auVar61._0_8_;
      } while (uVar35 + 1 != uVar32);
    }
    lVar40 = 0;
    do {
      pdVar15 = u[lVar26 + lVar40];
      lVar40 = lVar40 + 1;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = pdVar15[lVar37];
      in_ZMM1 = ZEXT1664(auVar97);
      auVar116._8_8_ = 0;
      auVar116._0_8_ = pdVar15[lVar43];
      auVar61 = vmulsd_avx512f(auVar131,auVar116);
      auVar60 = vmulsd_avx512f(auVar97,auVar154);
      auVar61 = vfmadd231sd_avx512f(auVar61,auVar137,auVar97);
      auVar60 = vfmadd231sd_avx512f(auVar60,auVar137,auVar116);
      vmovsd_avx512f(auVar61);
      pdVar15[lVar37] = pdVar15[lVar37];
      vmovsd_avx512f(auVar60);
      pdVar15[lVar43] = pdVar15[lVar43];
    } while (iVar25 != (int)lVar40);
    auVar74 = vunpcklpd_avx(auVar137,auVar74);
    in_ZMM11 = ZEXT1664(auVar74);
    local_c0 = uVar42;
  }
  auVar74 = in_ZMM14._0_16_;
  uVar32 = (ulong)local_c0;
  if ((int)local_c0 < (int)uVar27) goto LAB_0010d6b9;
  goto LAB_0010cbbf;
LAB_0010d6b9:
  auVar62 = vshufpd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_,1);
  goto LAB_0010c31c;
}

Assistant:

int EigenRealGeneral (int n, double **a, double *v, double *vi, double **u, int *iwork, double *work)
	/*      n = order of a                                                      */
	/*    **a = input matrix in row-ptr representation; will be destroyed       */
	/*     *v = array of size 'n' to receive eigenvalues                        */
	/*    *vi = work vector of size 'n' for imaginary components of eigenvalues */
	/*    **u = matrix in row-ptr representation to receive eigenvectors        */
	/* *iwork = work vector of size 'n'                                         */
	/*  *work = work vector of size 'n'                                         */
{
	int			i, rc;

	rc = EigenRG (n, a, v, vi, u, iwork, work);
	if (rc != NO_ERROR)
		{
		puts("\nInternal error in 'EigenRealGeneral'.");
		printf ("rc = %d\n", rc);
		return ERROR;
		}

	for (i = 0; i < n; i++)
		{
		if (vi[i] != 0.0)
			return RC_COMPLEX_EVAL;
		}

	return NO_ERROR;
}